

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O0

Status __thiscall
flatbuffers::BaseBfbsGenerator::GenerateCode
          (BaseBfbsGenerator *this,uint8_t *buffer,int64_t length,CodeGenOptions *options)

{
  bool bVar1;
  AdvancedFeatures AVar2;
  int iVar3;
  Schema *pSVar4;
  undefined4 extraout_var;
  Status status;
  uint64_t advance_features;
  Verifier verifier;
  CodeGenOptions *options_local;
  int64_t length_local;
  uint8_t *buffer_local;
  BaseBfbsGenerator *this_local;
  
  verifier.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)options;
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&advance_features,buffer,length,0x40,1000000,true);
  bVar1 = reflection::VerifySchemaBuffer((Verifier *)&advance_features);
  if (bVar1) {
    pSVar4 = reflection::GetSchema(buffer);
    this->schema_ = pSVar4;
    AVar2 = reflection::Schema::advanced_features(this->schema_);
    iVar3 = (*(this->super_CodeGenerator)._vptr_CodeGenerator[0xe])();
    if (CONCAT44(extraout_var,iVar3) < (ulong)AVar2) {
      this_local._4_4_ = FAILED_VERIFICATION;
    }
    else {
      this_local._4_4_ =
           (*(this->super_CodeGenerator)._vptr_CodeGenerator[0xd])
                     (this,this->schema_,verifier.flex_reuse_tracker_);
      this->schema_ = (Schema *)0x0;
    }
  }
  else {
    this_local._4_4_ = FAILED_VERIFICATION;
  }
  return this_local._4_4_;
}

Assistant:

Status GenerateCode(const uint8_t *buffer, int64_t length,
                      const CodeGenOptions &options) FLATBUFFERS_OVERRIDE {
    flatbuffers::Verifier verifier(buffer, static_cast<size_t>(length));
    if (!reflection::VerifySchemaBuffer(verifier)) {
      return FAILED_VERIFICATION;
    }

    // Store the root schema since there are cases where leaf nodes refer to
    // things in the root schema (e.g., indexing the objects).
    schema_ = reflection::GetSchema(buffer);

    const uint64_t advance_features = schema_->advanced_features();
    if (advance_features > SupportedAdvancedFeatures()) {
      return FAILED_VERIFICATION;
    }

    Status status = GenerateFromSchema(schema_, options);
    schema_ = nullptr;
    return status;
  }